

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O0

void __thiscall
sznet::net::EventLoopThread::EventLoopThread
          (EventLoopThread *this,ThreadInitCallback *cb,string *name)

{
  EventLoopThread *local_70;
  code *local_68;
  undefined8 local_60;
  type local_58;
  ThreadFunc local_40;
  string *local_20;
  string *name_local;
  ThreadInitCallback *cb_local;
  EventLoopThread *this_local;
  
  this->m_loop = (EventLoop *)0x0;
  this->m_exiting = false;
  local_68 = threadFunc;
  local_60 = 0;
  local_70 = this;
  local_20 = name;
  name_local = (string *)cb;
  cb_local = (ThreadInitCallback *)this;
  std::bind<void(sznet::net::EventLoopThread::*)(),sznet::net::EventLoopThread*>
            (&local_58,(offset_in_EventLoopThread_to_subr *)&local_68,&local_70);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::EventLoopThread::*(sznet::net::EventLoopThread*))()>,void>
            ((function<void()> *)&local_40,&local_58);
  Thread::Thread(&this->m_thread,&local_40,local_20);
  std::function<void_()>::~function(&local_40);
  MutexLock::MutexLock(&this->m_mutex);
  Condition::Condition(&this->m_cond,&this->m_mutex);
  std::function<void_(sznet::net::EventLoop_*)>::function
            (&this->m_callback,(function<void_(sznet::net::EventLoop_*)> *)name_local);
  return;
}

Assistant:

EventLoopThread::EventLoopThread(const ThreadInitCallback& cb, const string& name):
	m_loop(nullptr),
	m_exiting(false),
	m_thread(std::bind(&EventLoopThread::threadFunc, this), name),
	m_mutex(),
	m_cond(m_mutex),
	m_callback(cb)
{
}